

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

void alGenSources(ALsizei n,ALuint *sources)

{
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>_>
  __first;
  bool bVar1;
  undefined1 uVar2;
  ALCcontext *pAVar3;
  ALCcontext *pAVar4;
  ALsource *__args;
  ALuint *in_RSI;
  uint in_EDI;
  char *pcVar5;
  ALsource *source_1;
  vector<ALuint> ids;
  ALsource *source;
  ALCdevice *device;
  unique_lock<std::mutex> srclock;
  ContextRef context;
  mutex_type *in_stack_ffffffffffffff38;
  unique_lock<std::mutex> *in_stack_ffffffffffffff40;
  vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> *this;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>_>
  in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  intrusive_ptr<ALCcontext> *this_00;
  vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  ALuint AVar6;
  uint uVar7;
  vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> local_60;
  ALsource *local_48;
  ALCdevice *local_40;
  undefined4 local_28;
  intrusive_ptr<ALCcontext> local_18;
  ALuint *local_10;
  uint local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  GetContextRef();
  bVar1 = al::intrusive_ptr::operator_cast_to_bool((intrusive_ptr *)&local_18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if ((int)local_4 < 0) {
      pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_18);
      ALCcontext::setError(pAVar3,0xa003,"Generating %d sources",(ulong)local_4);
    }
    if ((int)local_4 < 1) {
      local_28 = 1;
    }
    else {
      al::intrusive_ptr<ALCcontext>::operator->(&local_18);
      std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38)
      ;
      pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_18);
      local_40 = al::intrusive_ptr<ALCdevice>::get(&pAVar3->mDevice);
      AVar6 = local_40->SourcesMax;
      uVar7 = local_4;
      pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_18);
      if (AVar6 - pAVar3->mNumSources < uVar7) {
        this_00 = &local_18;
        pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(this_00);
        AVar6 = local_40->SourcesMax;
        pAVar4 = al::intrusive_ptr<ALCcontext>::operator->(this_00);
        ALCcontext::setError
                  (pAVar3,0xa005,"Exceeding %u source limit (%u + %d)",(ulong)AVar6,
                   (ulong)pAVar4->mNumSources,(ulong)local_4);
        local_28 = 1;
      }
      else {
        al::intrusive_ptr<ALCcontext>::get(&local_18);
        uVar2 = anon_unknown.dwarf_41b5d::EnsureSources
                          ((ALCcontext *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           (size_t)in_stack_ffffffffffffff70);
        if ((bool)uVar2) {
          if (local_4 == 1) {
            al::intrusive_ptr<ALCcontext>::get(&local_18);
            local_48 = anon_unknown.dwarf_41b5d::AllocSource((ALCcontext *)CONCAT44(uVar7,AVar6));
            *local_10 = local_48->id;
          }
          else {
            this = &local_60;
            std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::vector
                      ((vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> *)0x15d2f5);
            std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::reserve
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
            do {
              al::intrusive_ptr<ALCcontext>::get(&local_18);
              __args = anon_unknown.dwarf_41b5d::AllocSource((ALCcontext *)CONCAT44(uVar7,AVar6));
              std::vector<unsigned_int,al::allocator<unsigned_int,4ul>>::emplace_back<unsigned_int&>
                        (this,(uint *)__args);
              local_4 = local_4 - 1;
            } while (local_4 != 0);
            in_stack_ffffffffffffff40 = (unique_lock<std::mutex> *)&local_60;
            std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::cbegin
                      ((vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> *)
                       in_stack_ffffffffffffff38);
            std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::cend
                      ((vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> *)
                       in_stack_ffffffffffffff38);
            __first._M_current._7_1_ = uVar2;
            __first._M_current._0_7_ = in_stack_ffffffffffffff60;
            std::
            copy<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,al::allocator<unsigned_int,4ul>>>,unsigned_int*>
                      (__first,in_stack_ffffffffffffff58,(uint *)this);
            std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::~vector(this);
          }
          local_28 = 0;
        }
        else {
          pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_18);
          pcVar5 = "s";
          if (local_4 == 1) {
            pcVar5 = "";
          }
          ALCcontext::setError(pAVar3,0xa005,"Failed to allocate %d source%s",(ulong)local_4,pcVar5)
          ;
          local_28 = 1;
        }
      }
      std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffff40);
    }
  }
  else {
    local_28 = 1;
  }
  al::intrusive_ptr<ALCcontext>::~intrusive_ptr
            ((intrusive_ptr<ALCcontext> *)in_stack_ffffffffffffff40);
  return;
}

Assistant:

AL_API void AL_APIENTRY alGenSources(ALsizei n, ALuint *sources)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    if UNLIKELY(n < 0)
        context->setError(AL_INVALID_VALUE, "Generating %d sources", n);
    if UNLIKELY(n <= 0) return;

    std::unique_lock<std::mutex> srclock{context->mSourceLock};
    ALCdevice *device{context->mDevice.get()};
    if(static_cast<ALuint>(n) > device->SourcesMax-context->mNumSources)
    {
        context->setError(AL_OUT_OF_MEMORY, "Exceeding %u source limit (%u + %d)",
            device->SourcesMax, context->mNumSources, n);
        return;
    }
    if(!EnsureSources(context.get(), static_cast<ALuint>(n)))
    {
        context->setError(AL_OUT_OF_MEMORY, "Failed to allocate %d source%s", n, (n==1)?"":"s");
        return;
    }

    if(n == 1)
    {
        ALsource *source{AllocSource(context.get())};
        sources[0] = source->id;
    }
    else
    {
        al::vector<ALuint> ids;
        ids.reserve(static_cast<ALuint>(n));
        do {
            ALsource *source{AllocSource(context.get())};
            ids.emplace_back(source->id);
        } while(--n);
        std::copy(ids.cbegin(), ids.cend(), sources);
    }
}